

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_XPM_Image.cxx
# Opt level: O0

void __thiscall Fl_XPM_Image::Fl_XPM_Image(Fl_XPM_Image *this,char *name)

{
  char cVar1;
  undefined1 auVar2 [16];
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  int local_908;
  int local_8f4;
  int local_8e8;
  int local_894;
  int xd_1;
  int x_1;
  int c;
  int xd;
  int x;
  int n;
  char *q;
  char *myp;
  int local_868;
  int chars_per_pixel;
  int ncolors;
  int H;
  int W;
  int i;
  char buffer [2068];
  int malloc_size;
  char **temp_data;
  char **new_data;
  FILE *local_20;
  FILE *f;
  char *name_local;
  Fl_XPM_Image *this_local;
  
  Fl_Pixmap::Fl_Pixmap(&this->super_Fl_Pixmap,(char **)0x0);
  (this->super_Fl_Pixmap).super_Fl_Image._vptr_Fl_Image = (_func_int **)&PTR__Fl_XPM_Image_002e5d30;
  local_20 = (FILE *)fl_fopen(name,"rb");
  if (local_20 != (FILE *)0x0) {
    temp_data = (char **)operator_new__(0x800);
    buffer[0x80c] = '\0';
    buffer[0x80d] = '\x01';
    buffer[0x80e] = '\0';
    buffer[0x80f] = '\0';
    H = 0;
    while (pcVar4 = fgets((char *)&W,0x814,local_20), pcVar4 != (char *)0x0) {
      if ((char)W == '\"') {
        pcVar4 = (char *)((long)&W + 1);
        q = (char *)&W;
        while (_x = pcVar4, *_x != '\"' && q < buffer + 0x7f8) {
          if (*_x == '\\') {
            pcVar4 = _x + 1;
            cVar1 = _x[1];
            if (cVar1 != '\0') {
              if ((cVar1 == '\n') || (cVar1 == '\r')) {
                fgets(pcVar4,((int)&W - (int)pcVar4) + 0x814,local_20);
              }
              else if (cVar1 == 'x') {
                _x = _x + 2;
                xd = 0;
                c = 0;
                while ((c < 2 && (iVar3 = hexdigit((int)*_x), iVar3 < 0x10))) {
                  xd = xd * 0x10 + iVar3;
                  _x = _x + 1;
                  c = c + 1;
                }
                *q = (char)xd;
                pcVar4 = _x;
                q = q + 1;
              }
              else {
                _x = _x + 2;
                xd_1._0_1_ = *pcVar4;
                iVar3 = (int)(char)xd_1;
                if ((0x2f < iVar3) && (iVar3 < 0x38)) {
                  xd_1 = iVar3 + -0x30;
                  local_894 = 0;
                  while ((local_894 < 2 && (iVar3 = hexdigit((int)*_x), iVar3 < 8))) {
                    xd_1 = xd_1 * 8 + iVar3;
                    _x = _x + 1;
                    local_894 = local_894 + 1;
                  }
                }
                *q = (char)xd_1;
                pcVar4 = _x;
                q = q + 1;
              }
            }
          }
          else {
            *q = *_x;
            pcVar4 = _x + 1;
            q = q + 1;
          }
        }
        *q = '\0';
        if ((int)buffer._2060_4_ <= H) {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (long)(buffer._2060_4_ + 0x100);
          uVar5 = SUB168(auVar2 * ZEXT816(8),0);
          if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
            uVar5 = 0xffffffffffffffff;
          }
          register0x00000000 = (char **)operator_new__(uVar5);
          memcpy(register0x00000000,temp_data,(long)(int)buffer._2060_4_ << 3);
          if (temp_data != (char **)0x0) {
            operator_delete__(temp_data);
          }
          temp_data = stack0xffffffffffffffc0;
          buffer._2060_4_ = buffer._2060_4_ + 0x100;
        }
        if ((H == 0) &&
           (iVar3 = __isoc99_sscanf(&W,"%d%d%d%d",&ncolors,&chars_per_pixel,&local_868,
                                    (long)&myp + 4), iVar3 < 4)) goto LAB_00210d24;
        if (local_868 < 0) {
          local_8e8 = 1;
        }
        else {
          local_8e8 = local_868;
        }
        if ((local_8e8 < H) && ((long)(q + -(long)&W) < (long)(ncolors * myp._4_4_)))
        goto LAB_00210d24;
        if (local_868 < 0) {
          local_8f4 = local_868 * -4;
        }
        else {
          local_8f4 = myp._4_4_;
        }
        if ((long)(q + -(long)&W) < (long)local_8f4) goto LAB_00210d24;
        pcVar4 = (char *)operator_new__((ulong)(q + (2 - (long)&W)));
        temp_data[H] = pcVar4;
        memcpy(temp_data[H],&W,(size_t)(q + (1 - (long)&W)));
        temp_data[H][(long)(q + (1 - (long)&W))] = '\0';
        H = H + 1;
      }
    }
    fclose(local_20);
    local_20 = (FILE *)0x0;
    if (H != 0) {
      if (local_868 < 0) {
        local_908 = 1;
      }
      else {
        local_908 = local_868;
      }
      if (local_908 + 1 + chars_per_pixel <= H) {
        Fl_Image::data((Fl_Image *)this,temp_data,H);
        (this->super_Fl_Pixmap).alloc_data = 1;
        Fl_Pixmap::measure(&this->super_Fl_Pixmap);
        return;
      }
    }
LAB_00210d24:
    while (0 < H) {
      H = H + -1;
      if (temp_data[H] != (char *)0x0) {
        operator_delete__(temp_data[H]);
      }
    }
    if (temp_data != (char **)0x0) {
      operator_delete__(temp_data);
    }
    if (local_20 != (FILE *)0x0) {
      fclose(local_20);
    }
  }
  return;
}

Assistant:

Fl_XPM_Image::Fl_XPM_Image(const char *name) : Fl_Pixmap((char *const*)0) {
  FILE *f;

  if ((f = fl_fopen(name, "rb")) == NULL) return;

  // read all the c-strings out of the file:
  char** new_data = new char *[INITIALLINES];
  char** temp_data;
  int malloc_size = INITIALLINES;
  char buffer[MAXSIZE+20];
  int i = 0;
  int W,H,ncolors,chars_per_pixel;
  while (fgets(buffer,MAXSIZE+20,f)) {
    if (buffer[0] != '\"') continue;
    char *myp = buffer;
    char *q = buffer+1;
    while (*q != '\"' && myp < buffer+MAXSIZE) {
      if (*q == '\\') switch (*++q) {
      case '\r':
      case '\n':
	if (!fgets(q,(int) (buffer+MAXSIZE+20-q),f)) { /* no problem if we hit EOF */ } break;
      case 0:
	break;
      case 'x': {
	q++;
	int n = 0;
	for (int x = 0; x < 2; x++) {
	  int xd = hexdigit(*q);
	  if (xd > 15) break;
	  n = (n<<4)+xd;
	  q++;
	}
	*myp++ = n;
      } break;
      default: {
	int c = *q++;
	if (c>='0' && c<='7') {
	  c -= '0';
	  for (int x=0; x<2; x++) {
	    int xd = hexdigit(*q);
	    if (xd>7) break;
	    c = (c<<3)+xd;
	    q++;
	  }
	}
	*myp++ = c;
      } break;
      } else {
	*myp++ = *q++;
      }
    }
    *myp++ = 0;
    if (i >= malloc_size) {
      temp_data = new char *[malloc_size + INITIALLINES];
      memcpy(temp_data, new_data, sizeof(char *) * malloc_size);
      delete[] new_data;
      new_data = temp_data;
      malloc_size += INITIALLINES;
    }
    // first line has 4 ints: width, height, ncolors, chars_per_pixel
    // followed by color segment: 
    //   if ncolors < 0 this is FLTK (non standard) compressed colormap - all colors coded in single line of 4*ncolors bytes
    //   otherwise - ncolor lines of at least chars_per_pixel bytes
    // followed by pic segment: H lines of at least chars_per_pixel*W bytes
    // next line: would have loved to use measure_pixmap, but it doesn't return all the data!
    if ((!i) && (sscanf(buffer,"%d%d%d%d", &W, &H, &ncolors, &chars_per_pixel) < 4)) goto bad_data; // first line
    else if ((i > (ncolors<0?1:ncolors)) && (myp-buffer-1<W*chars_per_pixel)) goto bad_data; // pic segment
    else if (myp-buffer-1<(ncolors<0?-ncolors*4:chars_per_pixel)) goto bad_data; // color segment
    new_data[i] = new char[myp-buffer+1];
    memcpy(new_data[i], buffer,myp-buffer);
    new_data[i][myp-buffer] = 0;
    i++;
  }

  fclose(f);
  f = NULL;
  if ((!i) || (i<1+(ncolors<0?1:ncolors)+H)) goto bad_data;
  data((const char **)new_data, i);
  alloc_data = 1;

  measure();
  return;
  // dealloc and close as needed when bad data was found
bad_data:
  while (i > 0) delete[] new_data[--i];
  delete[] new_data;
  if (f) fclose(f);
}